

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O0

void __thiscall miniros::ServicePublication::drop(ServicePublication *this)

{
  mutex_type *in_RDI;
  scoped_lock<std::mutex> lock;
  ServicePublication *in_stack_00000050;
  scoped_lock<std::mutex> *in_stack_fffffffffffffff0;
  
  std::scoped_lock<std::mutex>::scoped_lock(in_stack_fffffffffffffff0,in_RDI);
  in_RDI[6].super___mutex_base._M_mutex.__size[0x10] = '\x01';
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4a9788);
  dropAllConnections(in_stack_00000050);
  (*(code *)(in_RDI[6].super___mutex_base._M_mutex.__data.__list.__prev)->__prev[1].__next)();
  return;
}

Assistant:

void ServicePublication::drop()
{
  // grab a lock here, to ensure that no subscription callback will
  // be invoked after we return
  {
    std::scoped_lock<std::mutex> lock(client_links_mutex_);
    dropped_ = true;
  }

  dropAllConnections();

  callback_queue_->removeByID((uint64_t)this);
}